

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.cpp
# Opt level: O2

void __thiscall RPCServer::_DoAccept(RPCServer *this,Handle *handle,uint32_t param_2)

{
  element_type *peVar1;
  bool bVar2;
  SingletonLogger *this_00;
  int len;
  unique_lock<std::mutex> lock;
  char buf [8192];
  
  memset(buf,0,0x2000);
  len = 0x2000;
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->_mutex);
  bVar2 = ParsePackage::PackageFuncList
                    ((this->_parse_package).
                     super___shared_ptr<ParsePackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,buf,&len,
                     &this->_func_map);
  if (bVar2) {
    peVar1 = (handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_CNSocket[5])(peVar1,buf,(ulong)(uint)len);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return;
  }
  this_00 = cppnet::Singleton<cppnet::SingletonLogger>::Instance();
  cppnet::SingletonLogger::Error
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/test/rpc/rpc_server.cpp"
             ,0x72,"package functnion info failed!");
  abort();
}

Assistant:

void RPCServer::_DoAccept(cppnet::Handle handle, uint32_t) {
    char buf[8192] = { 0 };
    int len = 8192;

    std::unique_lock<std::mutex> lock(_mutex);
    if (!_parse_package->PackageFuncList(buf, len, _func_map)) {
        cppnet::LOG_ERROR("package functnion info failed!");
        abort();
    }
    handle->Write(buf, len);
}